

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationbuilder.cpp
# Opt level: O2

int64_t __thiscall
icu_63::CollationBuilder::getSpecialResetPosition
          (CollationBuilder *this,UnicodeString *str,char **parserErrorReason,UErrorCode *errorCode)

{
  int iVar1;
  uint32_t *puVar2;
  int64_t *piVar3;
  uint *puVar4;
  bool bVar5;
  char16_t cVar6;
  uint uVar7;
  int32_t index;
  uint32_t uVar8;
  uint uVar9;
  char *pcVar10;
  int64_t iVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  uint uStack_50;
  
  uStack_50 = 1;
  cVar6 = UnicodeString::doCharAt(str,1);
  bVar5 = true;
  switch(cVar6) {
  case L'⠂':
    uVar7 = findOrInsertNodeForRootCE(this,0,2,errorCode);
    if (U_ZERO_ERROR < *errorCode) {
      return 0;
    }
    iVar1 = (this->nodes).count;
    if ((int)uVar7 < iVar1 && -1 < (int)uVar7) {
      piVar3 = (this->nodes).elements;
      uVar7 = *(uint *)(piVar3 + uVar7) >> 8 & 0xfffff;
      if (((int)uVar7 < iVar1 && uVar7 != 0) && ((*(uint *)(piVar3 + uVar7) & 0xb) == 10)) {
        uStack_50 = 2;
        goto LAB_00235569;
      }
    }
    puVar4 = (this->rootElements).elements;
    return (ulong)(puVar4[*puVar4] & 0xffffff7f);
  case L'⠃':
    puVar2 = (this->rootElements).elements;
    uVar7 = puVar2[puVar2[1] - 1];
    uStack_50 = 2;
    goto LAB_00235339;
  case L'⠄':
    uStack_50 = 1;
    uVar7 = findOrInsertNodeForRootCE(this,0,1,errorCode);
    if (U_ZERO_ERROR < *errorCode) {
      return 0;
    }
    uVar12 = (this->nodes).count;
    piVar3 = (this->nodes).elements;
    if ((int)uVar7 < (int)uVar12 && -1 < (int)uVar7) {
      uVar15 = piVar3[uVar7];
    }
    else {
      uVar15 = 0;
    }
    do {
      uVar7 = (uint)(uVar15 >> 8) & 0xfffff;
      if (((uVar15 >> 8 & 0xfffff) == 0) || ((int)uVar12 <= (int)uVar7)) goto LAB_00235327;
      uVar15 = piVar3[uVar7];
      if ((uVar15 & 3) == 0) goto LAB_00235327;
    } while (((uint)uVar15 & 3) != 1);
    if ((uVar15 & 8) != 0) {
      if ((uVar15 & 0x20) != 0) {
        uVar9 = (uint)uVar15 >> 8 & 0xfffff;
        uVar7 = 0;
        if (uVar9 < uVar12) {
          uVar7 = *(uint *)(piVar3 + uVar9) >> 8 & 0xfffff;
        }
      }
      uStack_50 = 1;
      goto LAB_00235569;
    }
LAB_00235327:
    puVar2 = (this->rootElements).elements;
    uVar7 = puVar2[puVar2[1]];
LAB_00235339:
    uVar15 = (ulong)(uVar7 & 0xffffff7f);
    bVar5 = false;
    break;
  case L'⠅':
    puVar2 = (this->rootElements).elements;
    uVar15 = (ulong)(puVar2[puVar2[2] - 1] & 0xffffff7f);
    bVar5 = false;
    break;
  case L'⠆':
    puVar2 = (this->rootElements).elements;
    uVar15 = (ulong)puVar2[puVar2[2]] << 0x20 | 0x5000500;
    uStack_50 = 0;
    break;
  case L'⠇':
    uVar15 = CollationRootElements::lastCEWithPrimaryBefore
                       (&this->rootElements,this->variableTop + 1);
    goto LAB_002352dd;
  case L'⠈':
    uVar15 = CollationRootElements::firstCEWithPrimaryAtLeast
                       (&this->rootElements,this->variableTop + 1);
    uStack_50 = 0;
    break;
  case L'⠉':
    uVar8 = CollationData::getFirstPrimaryForGroup(this->baseData,0x11);
    uVar15 = CollationRootElements::firstCEWithPrimaryAtLeast(&this->rootElements,uVar8);
    goto LAB_002352dd;
  case L'⠊':
    uVar15 = CollationData::getSingleCE(this->baseData,0x4e00,errorCode);
LAB_002352dd:
    bVar5 = false;
    uStack_50 = 0;
    break;
  case L'⠋':
    *errorCode = U_UNSUPPORTED_ERROR;
    pcVar10 = "reset to [last implicit] not supported";
    goto LAB_002351c3;
  case L'⠌':
    uVar15 = 0xff02020005000500;
    uStack_50 = 0;
    break;
  case L'⠍':
    *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
    pcVar10 = "LDML forbids tailoring to U+FFFF";
LAB_002351c3:
    *parserErrorReason = pcVar10;
  default:
    goto LAB_00235355;
  }
  uVar7 = findOrInsertNodeForRootCE(this,uVar15,uStack_50,errorCode);
  if (U_ZERO_ERROR < *errorCode) {
LAB_00235355:
    return 0;
  }
  iVar1 = (this->nodes).count;
  if ((int)uVar7 < iVar1 && -1 < (int)uVar7) {
    uVar13 = (this->nodes).elements[uVar7];
  }
  else {
    uVar13 = 0;
  }
  if ((cVar6 & 1U) == 0) {
    if (bVar5 && (uVar13 & 0x60) == 0) {
      uVar7 = (uint)(uVar13 >> 8) & 0xfffff;
      if ((uVar13 >> 8 & 0xfffff) == 0) {
        uVar8 = (uint32_t)(uVar15 >> 0x20);
        index = CollationRootElements::findPrimary(&this->rootElements,uVar8);
        uVar8 = CollationRootElements::getPrimaryAfter
                          (&this->rootElements,uVar8,index,
                           this->baseData->compressibleBytes[uVar15 >> 0x38]);
        uVar15 = (ulong)uVar8 << 0x20 | 0x5000500;
        uVar7 = findOrInsertNodeForRootCE(this,uVar15,0,errorCode);
        if (U_ZERO_ERROR < *errorCode) {
          return 0;
        }
        if ((int)uVar7 < 0) {
          return uVar15;
        }
        if ((this->nodes).count <= (int)uVar7) {
          return uVar15;
        }
        uVar13 = (this->nodes).elements[uVar7];
      }
      else {
        if ((int)uVar7 < iVar1) {
          uVar13 = (this->nodes).elements[uVar7];
        }
        else {
          uVar13 = 0;
        }
        uVar15 = tempCEFromIndexAndStrength(uVar7,uStack_50);
      }
    }
    if ((uVar13 & 0x60) == 0) {
      return uVar15;
    }
    if ((uVar13 & 0x40) != 0) {
      uVar12 = (uint)(uVar13 >> 8) & 0xfffff;
      iVar1 = (this->nodes).count;
      uVar7 = 0;
      if ((int)uVar12 < iVar1) {
        uVar7 = *(uint *)((this->nodes).elements + uVar12) >> 8 & 0xfffff;
      }
      if (iVar1 <= (int)uVar7) goto LAB_00235569;
      uVar13 = (this->nodes).elements[uVar7];
    }
    if ((uVar13 & 0x20) != 0) {
      uVar12 = (uint)(uVar13 >> 8) & 0xfffff;
      uVar7 = 0;
      if ((int)uVar12 < (this->nodes).count) {
        uVar7 = *(uint *)((this->nodes).elements + uVar12) >> 8 & 0xfffff;
      }
    }
  }
  else {
    uVar12 = uVar7;
    do {
      uVar7 = uVar12;
      uVar14 = uVar13;
      uVar12 = (uint)(uVar14 >> 8) & 0xfffff;
      if ((uVar14 & 0xfffff00) == 0) break;
      if ((int)uVar12 < iVar1) {
        uVar13 = (this->nodes).elements[uVar12];
      }
      else {
        uVar13 = 0;
      }
    } while (uStack_50 <= ((uint)uVar13 & 3));
    if ((uVar14 & 8) == 0) {
      return uVar15;
    }
  }
LAB_00235569:
  iVar11 = tempCEFromIndexAndStrength(uVar7,uStack_50);
  return iVar11;
}

Assistant:

int64_t
CollationBuilder::getSpecialResetPosition(const UnicodeString &str,
                                          const char *&parserErrorReason, UErrorCode &errorCode) {
    U_ASSERT(str.length() == 2);
    int64_t ce;
    int32_t strength = UCOL_PRIMARY;
    UBool isBoundary = FALSE;
    UChar32 pos = str.charAt(1) - CollationRuleParser::POS_BASE;
    U_ASSERT(0 <= pos && pos <= CollationRuleParser::LAST_TRAILING);
    switch(pos) {
    case CollationRuleParser::FIRST_TERTIARY_IGNORABLE:
        // Quaternary CEs are not supported.
        // Non-zero quaternary weights are possible only on tertiary or stronger CEs.
        return 0;
    case CollationRuleParser::LAST_TERTIARY_IGNORABLE:
        return 0;
    case CollationRuleParser::FIRST_SECONDARY_IGNORABLE: {
        // Look for a tailored tertiary node after [0, 0, 0].
        int32_t index = findOrInsertNodeForRootCE(0, UCOL_TERTIARY, errorCode);
        if(U_FAILURE(errorCode)) { return 0; }
        int64_t node = nodes.elementAti(index);
        if((index = nextIndexFromNode(node)) != 0) {
            node = nodes.elementAti(index);
            U_ASSERT(strengthFromNode(node) <= UCOL_TERTIARY);
            if(isTailoredNode(node) && strengthFromNode(node) == UCOL_TERTIARY) {
                return tempCEFromIndexAndStrength(index, UCOL_TERTIARY);
            }
        }
        return rootElements.getFirstTertiaryCE();
        // No need to look for nodeHasAnyBefore() on a tertiary node.
    }
    case CollationRuleParser::LAST_SECONDARY_IGNORABLE:
        ce = rootElements.getLastTertiaryCE();
        strength = UCOL_TERTIARY;
        break;
    case CollationRuleParser::FIRST_PRIMARY_IGNORABLE: {
        // Look for a tailored secondary node after [0, 0, *].
        int32_t index = findOrInsertNodeForRootCE(0, UCOL_SECONDARY, errorCode);
        if(U_FAILURE(errorCode)) { return 0; }
        int64_t node = nodes.elementAti(index);
        while((index = nextIndexFromNode(node)) != 0) {
            node = nodes.elementAti(index);
            strength = strengthFromNode(node);
            if(strength < UCOL_SECONDARY) { break; }
            if(strength == UCOL_SECONDARY) {
                if(isTailoredNode(node)) {
                    if(nodeHasBefore3(node)) {
                        index = nextIndexFromNode(nodes.elementAti(nextIndexFromNode(node)));
                        U_ASSERT(isTailoredNode(nodes.elementAti(index)));
                    }
                    return tempCEFromIndexAndStrength(index, UCOL_SECONDARY);
                } else {
                    break;
                }
            }
        }
        ce = rootElements.getFirstSecondaryCE();
        strength = UCOL_SECONDARY;
        break;
    }
    case CollationRuleParser::LAST_PRIMARY_IGNORABLE:
        ce = rootElements.getLastSecondaryCE();
        strength = UCOL_SECONDARY;
        break;
    case CollationRuleParser::FIRST_VARIABLE:
        ce = rootElements.getFirstPrimaryCE();
        isBoundary = TRUE;  // FractionalUCA.txt: FDD1 00A0, SPACE first primary
        break;
    case CollationRuleParser::LAST_VARIABLE:
        ce = rootElements.lastCEWithPrimaryBefore(variableTop + 1);
        break;
    case CollationRuleParser::FIRST_REGULAR:
        ce = rootElements.firstCEWithPrimaryAtLeast(variableTop + 1);
        isBoundary = TRUE;  // FractionalUCA.txt: FDD1 263A, SYMBOL first primary
        break;
    case CollationRuleParser::LAST_REGULAR:
        // Use the Hani-first-primary rather than the actual last "regular" CE before it,
        // for backward compatibility with behavior before the introduction of
        // script-first-primary CEs in the root collator.
        ce = rootElements.firstCEWithPrimaryAtLeast(
            baseData->getFirstPrimaryForGroup(USCRIPT_HAN));
        break;
    case CollationRuleParser::FIRST_IMPLICIT:
        ce = baseData->getSingleCE(0x4e00, errorCode);
        break;
    case CollationRuleParser::LAST_IMPLICIT:
        // We do not support tailoring to an unassigned-implicit CE.
        errorCode = U_UNSUPPORTED_ERROR;
        parserErrorReason = "reset to [last implicit] not supported";
        return 0;
    case CollationRuleParser::FIRST_TRAILING:
        ce = Collation::makeCE(Collation::FIRST_TRAILING_PRIMARY);
        isBoundary = TRUE;  // trailing first primary (there is no mapping for it)
        break;
    case CollationRuleParser::LAST_TRAILING:
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        parserErrorReason = "LDML forbids tailoring to U+FFFF";
        return 0;
    default:
        U_ASSERT(FALSE);
        return 0;
    }

    int32_t index = findOrInsertNodeForRootCE(ce, strength, errorCode);
    if(U_FAILURE(errorCode)) { return 0; }
    int64_t node = nodes.elementAti(index);
    if((pos & 1) == 0) {
        // even pos = [first xyz]
        if(!nodeHasAnyBefore(node) && isBoundary) {
            // A <group> first primary boundary is artificially added to FractionalUCA.txt.
            // It is reachable via its special contraction, but is not normally used.
            // Find the first character tailored after the boundary CE,
            // or the first real root CE after it.
            if((index = nextIndexFromNode(node)) != 0) {
                // If there is a following node, then it must be tailored
                // because there are no root CEs with a boundary primary
                // and non-common secondary/tertiary weights.
                node = nodes.elementAti(index);
                U_ASSERT(isTailoredNode(node));
                ce = tempCEFromIndexAndStrength(index, strength);
            } else {
                U_ASSERT(strength == UCOL_PRIMARY);
                uint32_t p = (uint32_t)(ce >> 32);
                int32_t pIndex = rootElements.findPrimary(p);
                UBool isCompressible = baseData->isCompressiblePrimary(p);
                p = rootElements.getPrimaryAfter(p, pIndex, isCompressible);
                ce = Collation::makeCE(p);
                index = findOrInsertNodeForRootCE(ce, UCOL_PRIMARY, errorCode);
                if(U_FAILURE(errorCode)) { return 0; }
                node = nodes.elementAti(index);
            }
        }
        if(nodeHasAnyBefore(node)) {
            // Get the first node that was tailored before this one at a weaker strength.
            if(nodeHasBefore2(node)) {
                index = nextIndexFromNode(nodes.elementAti(nextIndexFromNode(node)));
                node = nodes.elementAti(index);
            }
            if(nodeHasBefore3(node)) {
                index = nextIndexFromNode(nodes.elementAti(nextIndexFromNode(node)));
            }
            U_ASSERT(isTailoredNode(nodes.elementAti(index)));
            ce = tempCEFromIndexAndStrength(index, strength);
        }
    } else {
        // odd pos = [last xyz]
        // Find the last node that was tailored after the [last xyz]
        // at a strength no greater than the position's strength.
        for(;;) {
            int32_t nextIndex = nextIndexFromNode(node);
            if(nextIndex == 0) { break; }
            int64_t nextNode = nodes.elementAti(nextIndex);
            if(strengthFromNode(nextNode) < strength) { break; }
            index = nextIndex;
            node = nextNode;
        }
        // Do not make a temporary CE for a root node.
        // This last node might be the node for the root CE itself,
        // or a node with a common secondary or tertiary weight.
        if(isTailoredNode(node)) {
            ce = tempCEFromIndexAndStrength(index, strength);
        }
    }
    return ce;
}